

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfTiledRgbaFile.cpp
# Opt level: O0

void __thiscall
Imf_2_5::TiledRgbaInputFile::readTile(TiledRgbaInputFile *this,int dx,int dy,int lx,int ly)

{
  Lock *in_RDI;
  Lock lock;
  int in_stack_000001b0;
  int in_stack_000001b4;
  int in_stack_000001b8;
  int in_stack_000001bc;
  FromYa *in_stack_000001c0;
  int in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffcc;
  Lock *in_stack_ffffffffffffffd0;
  
  if (in_RDI[1]._mutex == (Mutex *)0x0) {
    TiledInputFile::readTile
              ((TiledInputFile *)in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc,
               in_stack_ffffffffffffffc8,(int)((ulong)in_RDI >> 0x20),(int)in_RDI);
  }
  else {
    IlmThread_2_5::Lock::Lock
              (in_stack_ffffffffffffffd0,
               (Mutex *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
               SUB81((ulong)in_RDI >> 0x38,0));
    FromYa::readTile(in_stack_000001c0,in_stack_000001bc,in_stack_000001b8,in_stack_000001b4,
                     in_stack_000001b0);
    IlmThread_2_5::Lock::~Lock(in_RDI);
  }
  return;
}

Assistant:

void
TiledRgbaInputFile::readTile (int dx, int dy, int lx, int ly)
{
    if (_fromYa)
    {
	Lock lock (*_fromYa);
	_fromYa->readTile (dx, dy, lx, ly);
    }
    else
    {
	 _inputFile->readTile (dx, dy, lx, ly);
    }
}